

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  char cVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  void *__src;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  void *__dest;
  undefined1 *puVar13;
  int in_ESI;
  long in_RDI;
  u8 *pAddr_1;
  int top;
  int sz;
  int sz2;
  u8 *pAddr;
  u8 *pEnd;
  int iFree2;
  int iFree;
  int iCellStart;
  int iCellLast;
  int iCellFirst;
  uchar *src;
  uchar *temp;
  uchar *data;
  int nCell;
  int cbrk;
  int cellOffset;
  int usableSize;
  int size;
  int hdr;
  int pc;
  int i;
  uint local_80;
  uint local_7c;
  undefined1 *local_78;
  int local_30;
  int local_18;
  int local_4;
  
  __src = *(void **)(in_RDI + 0x50);
  uVar5 = (uint)*(byte *)(in_RDI + 9);
  uVar6 = (uint)*(ushort *)(in_RDI + 0x12);
  uVar7 = (uint)*(ushort *)(in_RDI + 0x18);
  iVar8 = uVar6 + uVar7 * 2;
  iVar10 = *(int *)(*(long *)(in_RDI + 0x48) + 0x38);
  if ((int)(uint)*(byte *)((long)__src + (long)(int)(uVar5 + 7)) <= in_ESI) {
    uVar9 = (uint)CONCAT11(*(undefined1 *)((long)__src + (long)(int)(uVar5 + 1)),
                           *(undefined1 *)((long)__src + (long)(int)(uVar5 + 1) + 1));
    if (iVar10 + -4 < (int)uVar9) {
      iVar10 = sqlite3CorruptError(0);
      return iVar10;
    }
    if (uVar9 != 0) {
      uVar11 = (uint)CONCAT11(*(undefined1 *)((long)__src + (long)(int)uVar9),
                              *(undefined1 *)((long)__src + (long)(int)uVar9 + 1));
      if (iVar10 + -4 < (int)uVar11) {
        iVar10 = sqlite3CorruptError(0);
        return iVar10;
      }
      if ((uVar11 == 0) ||
         ((*(char *)((long)__src + (long)(int)uVar11) == '\0' &&
          (*(char *)((long)__src + (long)(int)(uVar11 + 1)) == '\0')))) {
        local_7c = 0;
        local_80 = (uint)CONCAT11(*(undefined1 *)((long)__src + (long)(int)(uVar9 + 2)),
                                  *(undefined1 *)((long)__src + (long)(int)(uVar9 + 2) + 1));
        uVar12 = (uint)CONCAT11(*(undefined1 *)((long)__src + (long)(int)(uVar5 + 5)),
                                *(undefined1 *)((long)__src + (long)(int)(uVar5 + 5) + 1));
        if (uVar9 <= uVar12) {
          iVar10 = sqlite3CorruptError(0);
          return iVar10;
        }
        if (uVar11 == 0) {
          if (iVar10 < (int)(uVar9 + local_80)) {
            iVar10 = sqlite3CorruptError(0);
            return iVar10;
          }
        }
        else {
          if (uVar11 < uVar9 + local_80) {
            iVar10 = sqlite3CorruptError(0);
            return iVar10;
          }
          local_7c = (uint)CONCAT11(*(undefined1 *)((long)__src + (long)(int)(uVar11 + 2)),
                                    *(undefined1 *)((long)__src + (long)(int)(uVar11 + 2) + 1));
          if (iVar10 < (int)(uVar11 + local_7c)) {
            iVar10 = sqlite3CorruptError(0);
            return iVar10;
          }
          memmove((void *)((long)__src + (long)(int)(uVar9 + local_80 + local_7c)),
                  (void *)((long)__src + (long)(int)(uVar9 + local_80)),
                  (long)(int)(uVar11 - (uVar9 + local_80)));
          local_80 = local_7c + local_80;
        }
        local_30 = uVar12 + local_80;
        memmove((void *)((long)__src + (long)local_30),(void *)((long)__src + (long)(int)uVar12),
                (long)(int)(uVar9 - uVar12));
        for (local_78 = (undefined1 *)((long)__src + (long)(int)uVar6);
            local_78 < (undefined1 *)((long)__src + (long)(int)(uVar6 + uVar7 * 2));
            local_78 = local_78 + 2) {
          cVar1 = local_78[1];
          uVar12 = (uint)CONCAT11(*local_78,cVar1);
          if (uVar12 < uVar9) {
            *local_78 = (char)(uVar12 + local_80 >> 8);
            local_78[1] = cVar1 + (char)local_80;
          }
          else if (uVar12 < uVar11) {
            *local_78 = (char)(uVar12 + local_7c >> 8);
            local_78[1] = cVar1 + (char)local_7c;
          }
        }
        goto LAB_001942c0;
      }
    }
  }
  uVar2 = *(undefined1 *)((long)__src + (long)(int)(uVar5 + 5));
  uVar3 = *(undefined1 *)((long)__src + (long)(int)(uVar5 + 5) + 1);
  local_30 = iVar10;
  if (uVar7 != 0) {
    __dest = sqlite3PagerTempSpace((Pager *)**(undefined8 **)(in_RDI + 0x48));
    memcpy(__dest,__src,(long)iVar10);
    for (local_18 = 0; local_18 < (int)uVar7; local_18 = local_18 + 1) {
      puVar13 = (undefined1 *)((long)__src + (long)(int)(uVar6 + local_18 * 2));
      uVar9 = (uint)CONCAT11(*puVar13,puVar13[1]);
      if (iVar10 + -4 < (int)uVar9) {
        iVar10 = sqlite3CorruptError(0);
        return iVar10;
      }
      uVar4 = (**(code **)(in_RDI + 0x78))(in_RDI,(long)__dest + (long)(int)uVar9);
      uVar11 = (uint)uVar4;
      local_30 = local_30 - uVar11;
      if ((local_30 < (int)(uint)CONCAT11(uVar2,uVar3)) || (iVar10 < (int)(uVar9 + uVar11))) {
        iVar10 = sqlite3CorruptError(0);
        return iVar10;
      }
      *puVar13 = (char)((uint)local_30 >> 8);
      puVar13[1] = (char)local_30;
      memcpy((void *)((long)__src + (long)local_30),(void *)((long)__dest + (long)(int)uVar9),
             (long)(int)uVar11);
    }
  }
  *(undefined1 *)((long)__src + (long)(int)(uVar5 + 7)) = 0;
LAB_001942c0:
  if (((uint)*(byte *)((long)__src + (long)(int)(uVar5 + 7)) + local_30) - iVar8 ==
      *(int *)(in_RDI + 0x14)) {
    *(char *)((long)__src + (long)(int)(uVar5 + 5)) = (char)((uint)local_30 >> 8);
    *(char *)((long)__src + (long)(int)(uVar5 + 5) + 1) = (char)local_30;
    *(undefined1 *)((long)__src + (long)(int)(uVar5 + 1)) = 0;
    *(undefined1 *)((long)__src + (long)(int)(uVar5 + 2)) = 0;
    memset((void *)((long)__src + (long)iVar8),0,(long)(local_30 - iVar8));
    local_4 = 0;
  }
  else {
    local_4 = sqlite3CorruptError(0);
  }
  return local_4;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */
  int iCellStart;            /* First cell offset in input */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) || CORRUPT_DB );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);
      if( iFree2>usableSize-4 ) return SQLITE_CORRUPT_PAGE(pPage);
      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          if( iFree+sz>iFree2 ) return SQLITE_CORRUPT_PAGE(pPage);
          sz2 = get2byte(&data[iFree2+2]);
          if( iFree2+sz2 > usableSize ) return SQLITE_CORRUPT_PAGE(pPage);
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }else if( iFree+sz>usableSize ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }

        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  iCellStart = get2byte(&data[hdr+5]);
  if( nCell>0 ){
    temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
    memcpy(temp, data, usableSize);
    src = temp;
    for(i=0; i<nCell; i++){
      u8 *pAddr;     /* The i-th cell pointer */
      pAddr = &data[cellOffset + i*2];
      pc = get2byte(pAddr);
      testcase( pc==iCellFirst );
      testcase( pc==iCellLast );
      /* These conditions have already been verified in btreeInitPage()
      ** if PRAGMA cell_size_check=ON.
      */
      if( pc>iCellLast ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( pc>=0 && pc<=iCellLast );
      size = pPage->xCellSize(pPage, &src[pc]);
      cbrk -= size;
      if( cbrk<iCellStart || pc+size>usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      assert( cbrk+size<=usableSize && cbrk>=iCellStart );
      testcase( cbrk+size==usableSize );
      testcase( pc+size==usableSize );
      put2byte(pAddr, cbrk);
      memcpy(&data[cbrk], &src[pc], size);
    }
  }
  data[hdr+7] = 0;

defragment_out:
  assert( pPage->nFree>=0 );
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}